

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxscaler.hpp
# Opt level: O2

double __thiscall soplex::SPxScaler<double>::minAbsRowscale(SPxScaler<double> *this)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  int __exponent;
  double dVar5;
  
  uVar1 = this->m_activeRowscaleExp->thesize;
  uVar4 = 0;
  uVar3 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar3 = uVar4;
  }
  __exponent = 0x7fffffff;
  for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
    iVar2 = this->m_activeRowscaleExp->data[uVar4];
    if (iVar2 < __exponent) {
      __exponent = iVar2;
    }
  }
  dVar5 = ldexp(1.0,__exponent);
  return dVar5;
}

Assistant:

R SPxScaler<R>::minAbsRowscale() const
{
   const DataArray < int >& rowscaleExp = *m_activeRowscaleExp;

   int mini = std::numeric_limits<int>::max();

   for(int i = 0; i < rowscaleExp.size(); ++i)
      if(rowscaleExp[i] < mini)
         mini = rowscaleExp[i];

   return spxLdexp(1.0, mini);
}